

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall Handler::InputVirtualMachine(Handler *this)

{
  vector<VirtualMachine,_std::allocator<VirtualMachine>_> *this_00;
  int iVar1;
  undefined4 uVar2;
  char *__nptr;
  int *piVar3;
  ulong uVar4;
  istream *piVar5;
  string *this_01;
  mapped_type *pmVar6;
  undefined8 uVar7;
  short sVar8;
  long lVar9;
  pointer pVVar10;
  string MStr;
  string memorySizeStr;
  string cpuCoreStr;
  string modelStr;
  string nodeNumStr;
  char *local_f8;
  undefined8 local_f0;
  char local_e8 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_d8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  char *local_70;
  undefined8 local_68;
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  local_f8 = local_e8;
  local_f0 = 0;
  local_e8[0] = '\0';
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&local_f8);
  __nptr = local_f8;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtol(__nptr,local_50,10);
  if (local_50[0] == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar4 == uVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    this->M = (uint16_t)uVar4;
    this_00 = &this->virtualMachines;
    std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::resize(this_00,uVar4 & 0xffff);
    if (this->M != 0) {
      local_d8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->virtualMachineMap;
      uVar4 = 0;
      do {
        piVar5 = std::operator>>((istream *)&std::cin,(string *)&local_90);
        piVar5 = std::operator>>(piVar5,(string *)&local_b0);
        piVar5 = std::operator>>(piVar5,(string *)&local_d0);
        std::operator>>(piVar5,(string *)&local_70);
        this_01 = (string *)operator_new(0x28);
        *(undefined8 *)(this_01 + 0x20) = 0;
        *(undefined8 *)(this_01 + 0x10) = 0;
        *(undefined8 *)(this_01 + 0x18) = 0;
        *(string **)this_01 = this_01 + 0x10;
        *(undefined8 *)(this_01 + 8) = 0;
        *(undefined2 *)(this_01 + 0x20) = 0;
        this_01[0x24] = (string)0x0;
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
        std::__cxx11::string::operator=(this_01,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_a8 == 1) {
          sVar8 = 0;
        }
        else {
          lVar9 = 0;
          sVar8 = 0;
          do {
            sVar8 = sVar8 * 10 + (short)(char)local_b0[lVar9] + -0x30;
            lVar9 = lVar9 + 1;
          } while (local_a8 + -1 != lVar9);
        }
        *(short *)(this_01 + 0x20) = sVar8;
        if (local_c8 == 1) {
          sVar8 = 0;
        }
        else {
          lVar9 = 0;
          sVar8 = 0;
          do {
            sVar8 = sVar8 * 10 + (short)(char)local_d0[lVar9] + -0x30;
            lVar9 = lVar9 + 1;
          } while (local_c8 + -1 != lVar9);
        }
        *(short *)(this_01 + 0x22) = sVar8;
        this_01[0x24] = (string)(*local_70 == '1');
        pVVar10 = (this_00->super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar4;
        std::__cxx11::string::_M_assign((string *)pVVar10);
        pVVar10->nodeType = (bool)this_01[0x24];
        uVar2 = *(undefined4 *)(this_01 + 0x20);
        pVVar10->cpuCore = (short)uVar2;
        pVVar10->memorySize = (short)((uint)uVar2 >> 0x10);
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_d8,&(this_00->
                                        super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar4].model);
        *pmVar6 = (mapped_type)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->M);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    return;
  }
  uVar7 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar1;
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

void Handler::InputVirtualMachine() {
    string MStr, modelStr, cpuCoreStr, memorySizeStr, nodeNumStr;
    uint16_t cpuCore;
    uint16_t memorySize;

    std::cin >> MStr;
    M = (uint16_t) std::stoi(MStr);
    virtualMachines.resize(M);

    for (uint16_t i = 0u; i < M; ++i) {
        std::cin >> modelStr >> cpuCoreStr >> memorySizeStr >> nodeNumStr;
        auto *vm = new VirtualMachine();

        vm->model = modelStr.substr(1, modelStr.size() - 2);

        cpuCore = 0u;
        for (int j = 0; j < cpuCoreStr.size() - 1; ++j) {
            cpuCore = cpuCore * 10 + (cpuCoreStr[j] - 48);
        }
        vm->cpuCore = cpuCore;

        memorySize = 0u;
        for (int j = 0; j < memorySizeStr.size() - 1; ++j) {
            memorySize = memorySize * 10 + (memorySizeStr[j] - 48);
        }
        vm->memorySize = memorySize;

        vm->nodeType = (nodeNumStr[0] == '1');
        virtualMachines[i] = *vm;
        virtualMachineMap[virtualMachines[i].model] = i;
    }
}